

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::swap
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,
          SmallVectorBase<slang::IntervalMapDetails::NodeRef> *rhs)

{
  bool bVar1;
  unsigned_long *puVar2;
  reference __a;
  reference __b;
  size_type sVar3;
  size_type sVar4;
  __uninitialized_copy_fn *this_00;
  __uninitialized_copy_fn *p_Var5;
  iterator pNVar6;
  iterator __ofirst;
  __destroy_fn *this_01;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *in_RDI;
  size_type i;
  size_type numShared;
  NodeRef *in_stack_ffffffffffffff40;
  NodeRef *in_stack_ffffffffffffff48;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *in_stack_ffffffffffffff50;
  NodeRef *in_stack_ffffffffffffff58;
  __uninitialized_copy_fn *in_stack_ffffffffffffff60;
  ulong local_30;
  size_type local_28;
  size_type local_20;
  ulong local_18;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> *local_10;
  
  if (in_RDI != in_RSI) {
    local_10 = in_RSI;
    bVar1 = isSmall(in_RDI);
    if ((bVar1) || (bVar1 = isSmall(local_10), bVar1)) {
      size(local_10);
      reserve(in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      size(in_RDI);
      reserve(in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      local_20 = size(in_RDI);
      local_28 = size(local_10);
      puVar2 = std::min<unsigned_long>(&local_20,&local_28);
      local_18 = *puVar2;
      for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
        __a = operator[](in_RDI,local_30);
        __b = operator[](local_10,local_30);
        std::swap<slang::IntervalMapDetails::NodeRef>(__a,__b);
      }
      sVar3 = size(in_RDI);
      sVar4 = size(local_10);
      if (sVar4 < sVar3) {
        begin(in_RDI);
        end(in_RDI);
        end(local_10);
        end(local_10);
        size(in_RDI);
        std::ranges::__uninitialized_copy_fn::
        operator()<slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*>
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (NodeRef *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40);
        local_10->len = in_RDI->len;
        begin(in_RDI);
        end(in_RDI);
        std::ranges::__destroy_fn::
        operator()<slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*>
                  ((__destroy_fn *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff40);
        in_RDI->len = local_18;
      }
      else {
        this_00 = (__uninitialized_copy_fn *)size(local_10);
        p_Var5 = (__uninitialized_copy_fn *)size(in_RDI);
        if (p_Var5 < this_00) {
          pNVar6 = begin(local_10);
          pNVar6 = pNVar6 + local_18;
          __ofirst = end(local_10);
          this_01 = (__destroy_fn *)end(in_RDI);
          end(in_RDI);
          size(local_10);
          std::ranges::__uninitialized_copy_fn::
          operator()<slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*>
                    (this_00,in_stack_ffffffffffffff58,(NodeRef *)this_01,__ofirst,pNVar6);
          in_RDI->len = local_10->len;
          begin(local_10);
          end(local_10);
          std::ranges::__destroy_fn::
          operator()<slang::IntervalMapDetails::NodeRef_*,_slang::IntervalMapDetails::NodeRef_*>
                    (this_01,__ofirst,pNVar6);
          local_10->len = local_18;
        }
      }
    }
    else {
      std::swap<slang::IntervalMapDetails::NodeRef*>(&in_RDI->data_,&local_10->data_);
      std::swap<unsigned_long>(&in_RDI->len,&local_10->len);
      std::swap<unsigned_long>(&in_RDI->cap,&local_10->cap);
    }
  }
  return;
}

Assistant:

void SmallVectorBase<T>::swap(SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return;

    // We can only do a true swap if neither vector is small.
    if (!isSmall() && !rhs.isSmall()) {
        std::swap(data_, rhs.data_);
        std::swap(len, rhs.len);
        std::swap(cap, rhs.cap);
        return;
    }

    // Make sure each container has enough space for each other's elements.
    reserve(rhs.size());
    rhs.reserve(size());

    // Swap the shared elements.
    size_type numShared = std::min(size(), rhs.size());
    for (size_type i = 0; i < numShared; i++)
        std::swap((*this)[i], rhs[i]);

    // Copy over the extra elements from whichever side is larger.
    if (size() > rhs.size()) {
        std::ranges::uninitialized_copy(begin() + numShared, end(), rhs.end(),
                                        rhs.end() + size() - numShared);
        rhs.len = len;

        std::ranges::destroy(begin() + numShared, end());
        len = numShared;
    }
    else if (rhs.size() > size()) {
        std::ranges::uninitialized_copy(rhs.begin() + numShared, rhs.end(), end(),
                                        end() + rhs.size() - numShared);
        len = rhs.len;

        std::ranges::destroy(rhs.begin() + numShared, rhs.end());
        rhs.len = numShared;
    }
}